

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderPrimitiveCounter.hpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderPrimitiveCounter::~GeometryShaderPrimitiveCounter
          (GeometryShaderPrimitiveCounter *this)

{
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GeometryShaderPrimitiveCounter_01e00d80;
  DataPrimitiveIDInCounter::~DataPrimitiveIDInCounter(&this->m_testConfiguration);
  TestCaseBase::~TestCaseBase(&this->super_TestCaseBase);
  return;
}

Assistant:

virtual ~GeometryShaderPrimitiveCounter(void)
	{
	}